

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Value::operator==(Value *this,Value *other)

{
  int iVar1;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *__x;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *pmVar2;
  double *in_RSI;
  double *in_RDI;
  int temp;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *in_stack_ffffffffffffffb8;
  bool local_33;
  bool local_32;
  bool local_31;
  bool local_1;
  
  if ((*(ushort *)(in_RDI + 1) & 0xff) == (*(ushort *)(in_RSI + 1) & 0xff)) {
    switch(*(undefined1 *)(in_RDI + 1)) {
    case 0:
      local_1 = true;
      break;
    case 1:
      local_1 = *in_RDI == *in_RSI;
      break;
    case 2:
      local_1 = *in_RDI == *in_RSI;
      break;
    case 3:
      local_1 = *in_RDI == *in_RSI;
      break;
    case 4:
      local_31 = true;
      if (*in_RDI != *in_RSI) {
        local_32 = false;
        if ((*in_RSI != 0.0) && (local_32 = false, *in_RDI != 0.0)) {
          iVar1 = strcmp((char *)*in_RDI,(char *)*in_RSI);
          local_32 = iVar1 == 0;
        }
        local_31 = local_32;
      }
      local_1 = local_31;
      break;
    case 5:
      local_1 = (*(byte *)in_RDI & 1) == (*(byte *)in_RSI & 1);
      break;
    case 6:
    case 7:
      __x = (map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
             *)std::
               map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
               ::size((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                       *)0x12c696);
      pmVar2 = (map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                *)std::
                  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                  ::size((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                          *)0x12c6a8);
      local_33 = false;
      if (__x == pmVar2) {
        local_33 = std::operator==(__x,in_stack_ffffffffffffffb8);
      }
      local_1 = local_33;
      break;
    default:
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Value::operator==(const Value& other) const {
  // if ( type_ != other.type_ )
  // GCC 2.95.3 says:
  // attempt to take address of bit-field structure member `Json::Value::type_'
  // Beats me, but a temp solves the problem.
  int temp = other.type_;
  if (type_ != temp)
    return false;
  switch (type_) {
  case nullValue:
    return true;
  case intValue:
    return value_.int_ == other.value_.int_;
  case uintValue:
    return value_.uint_ == other.value_.uint_;
  case realValue:
    return value_.real_ == other.value_.real_;
  case booleanValue:
    return value_.bool_ == other.value_.bool_;
  case stringValue:
    return (value_.string_ == other.value_.string_) ||
           (other.value_.string_ && value_.string_ &&
            strcmp(value_.string_, other.value_.string_) == 0);
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  case arrayValue:
  case objectValue:
    return value_.map_->size() == other.value_.map_->size() &&
           (*value_.map_) == (*other.value_.map_);
#else
  case arrayValue:
    return value_.array_->compare(*(other.value_.array_)) == 0;
  case objectValue:
    return value_.map_->compare(*(other.value_.map_)) == 0;
#endif
  default:
    JSON_ASSERT_UNREACHABLE;
  }
  return false; // unreachable
}